

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws_dll2.c
# Opt level: O3

void lws_dll2_describe(lws_dll2_owner_t *owner,char *desc)

{
  lws_dll2 *plVar1;
  ulong uVar2;
  lws_dll2 *plVar3;
  
  _lws_log(8,"%s: %s: owner %p: count %d, head %p, tail %p\n","lws_dll2_describe",desc,owner,
           (ulong)owner->count,owner->head,owner->tail);
  if (owner->head != (lws_dll2 *)0x0) {
    uVar2 = 1;
    plVar3 = owner->head;
    do {
      plVar1 = plVar3->next;
      _lws_log(8,"%s:    %d: %p: owner %p, prev %p, next %p\n","lws_dll2_describe",uVar2,plVar3,
               plVar3->owner,plVar3->prev,plVar1);
      uVar2 = (ulong)((int)uVar2 + 1);
      plVar3 = plVar1;
    } while (plVar1 != (lws_dll2 *)0x0);
  }
  return;
}

Assistant:

void
lws_dll2_describe(lws_dll2_owner_t *owner, const char *desc)
{
	int n = 1;

	lwsl_info("%s: %s: owner %p: count %d, head %p, tail %p\n",
		    __func__, desc, owner, (int)owner->count, owner->head, owner->tail);

	lws_start_foreach_dll_safe(struct lws_dll2 *, p, tp,
				   lws_dll2_get_head(owner)) {
		lwsl_info("%s:    %d: %p: owner %p, prev %p, next %p\n",
			    __func__, n++, p, p->owner, p->prev, p->next);
	} lws_end_foreach_dll_safe(p, tp);
}